

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void quantize_row_q2_K_ref(float *x,block_q2_K *y,int64_t k)

{
  byte bVar1;
  ushort uVar2;
  ggml_fp16_t gVar3;
  int j_1;
  ulong uVar4;
  float *pfVar5;
  int l;
  long lVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  ulong uVar9;
  block_q2_K *pbVar10;
  uint uVar11;
  int j;
  long lVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  uint8_t *local_218;
  uint8_t Laux [16];
  float scales [16];
  float mins [16];
  float weights [16];
  uint8_t L [256];
  
  uVar13 = 0;
  uVar4 = k / 0x100 & 0xffffffff;
  if ((int)(k / 0x100) < 1) {
    uVar4 = uVar13;
  }
  local_218 = y->qs;
  pbVar10 = y;
  for (; uVar13 != uVar4; uVar13 = uVar13 + 1) {
    pfVar5 = x;
    fVar16 = 0.0;
    fVar15 = 0.0;
    for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
      for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
        weights[lVar6] = ABS(pfVar5[lVar6]);
      }
      fVar14 = make_qkx2_quants(0x10,3,x + lVar12 * 0x10,weights,L + lVar12 * 0x10,mins + lVar12,
                                Laux,-0.5,NAN,0xf,true);
      scales[lVar12] = fVar14;
      if (fVar14 <= fVar16) {
        fVar14 = fVar16;
      }
      fVar17 = mins[lVar12];
      if (fVar17 <= fVar15) {
        fVar17 = fVar15;
      }
      pfVar5 = pfVar5 + 0x10;
      fVar16 = fVar14;
      fVar15 = fVar17;
    }
    if (fVar16 <= 0.0) {
      for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
        pbVar10->scales[lVar12] = '\0';
      }
      uVar2 = 0;
    }
    else {
      for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
        pbVar10->scales[lVar12] = SUB41(scales[lVar12] * (15.0 / fVar16) + 12582912.0,0);
      }
      uVar2 = ggml_compute_fp32_to_fp16(fVar16 / 15.0);
    }
    y[uVar13].field_2.field_0.d = uVar2;
    if (fVar15 <= 0.0) {
      y[uVar13].field_2.field_0.dmin = 0;
      uVar9 = 0;
    }
    else {
      for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
        pbVar10->scales[lVar12] =
             pbVar10->scales[lVar12] | SUB41(mins[lVar12] * (15.0 / fVar15) + 12582912.0,0) << 4;
      }
      gVar3 = ggml_compute_fp32_to_fp16(fVar15 / 15.0);
      y[uVar13].field_2.field_0.dmin = gVar3;
      uVar2 = y[uVar13].field_2.field_0.d;
      uVar9 = (ulong)gVar3;
    }
    fVar16 = ggml_table_f32_f16[uVar2];
    puVar8 = L;
    pfVar5 = x;
    for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
      bVar1 = y[uVar13].scales[lVar12];
      fVar15 = (float)(bVar1 & 0xf) * fVar16;
      if ((fVar15 != 0.0) || (NAN(fVar15))) {
        fVar14 = ggml_table_f32_f16[uVar9];
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
          uVar11 = (uint)((pfVar5[lVar6] + (float)(bVar1 >> 4) * fVar14) / fVar15 + 12582912.0) &
                   0x7fffff;
          if (0x400002 < uVar11) {
            uVar11 = 0x400003;
          }
          if (uVar11 < 0x400001) {
            uVar11 = 0;
          }
          puVar8[lVar6] = (uint8_t)uVar11;
        }
      }
      puVar8 = puVar8 + 0x10;
      pfVar5 = pfVar5 + 0x10;
    }
    puVar8 = L + 0x60;
    puVar7 = local_218;
    for (uVar9 = 0; uVar9 < 0x100; uVar9 = uVar9 + 0x80) {
      for (lVar12 = -0x20; lVar12 != 0; lVar12 = lVar12 + 1) {
        puVar7[lVar12 + 0x20] =
             puVar8[lVar12 + 0x20] << 6 | puVar8[lVar12] << 4 |
             puVar8[lVar12 + -0x20] << 2 | puVar8[lVar12 + -0x40];
      }
      puVar7 = puVar7 + 0x20;
      puVar8 = puVar8 + 0x80;
    }
    x = x + 0x100;
    pbVar10 = pbVar10 + 1;
    local_218 = local_218 + 0x54;
  }
  return;
}

Assistant:

void quantize_row_q2_K_ref(const float * GGML_RESTRICT x, block_q2_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    uint8_t L[QK_K];
    uint8_t Laux[16];
    float   weights[16];
    float mins[QK_K/16];
    float scales[QK_K/16];

    const float q4scale = 15.f;

    for (int i = 0; i < nb; i++) {
        float max_scale = 0; // as we are deducting the min, scales are always positive
        float max_min = 0;
        for (int j = 0; j < QK_K/16; ++j) {
            for (int l = 0; l < 16; ++l) weights[l] = fabsf(x[16*j + l]);
            scales[j] = make_qkx2_quants(16, 3, x + 16*j, weights, L + 16*j, &mins[j], Laux, -0.5f, 0.1f, 15, true);
            float scale = scales[j];
            if (scale > max_scale) {
                max_scale = scale;
            }
            float min = mins[j];
            if (min > max_min) {
                max_min = min;
            }
        }

        if (max_scale > 0) {
            float iscale = q4scale/max_scale;
            for (int j = 0; j < QK_K/16; ++j) {
                int l = nearest_int(iscale*scales[j]);
                y[i].scales[j] = l;
            }
            y[i].d = GGML_FP32_TO_FP16(max_scale/q4scale);
        } else {
            for (int j = 0; j < QK_K/16; ++j) y[i].scales[j] = 0;
            y[i].d = GGML_FP32_TO_FP16(0.f);
        }
        if (max_min > 0) {
            float iscale = q4scale/max_min;
            for (int j = 0; j < QK_K/16; ++j) {
                int l = nearest_int(iscale*mins[j]);
                y[i].scales[j] |= (l << 4);
            }
            y[i].dmin = GGML_FP32_TO_FP16(max_min/q4scale);
        } else {
            y[i].dmin = GGML_FP32_TO_FP16(0.f);
        }
        for (int j = 0; j < QK_K/16; ++j) {
            const float d = GGML_FP16_TO_FP32(y[i].d) * (y[i].scales[j] & 0xF);
            if (!d) continue;
            const float dm = GGML_FP16_TO_FP32(y[i].dmin) * (y[i].scales[j] >> 4);
            for (int ii = 0; ii < 16; ++ii) {
                int l = nearest_int((x[16*j + ii] + dm)/d);
                l = MAX(0, MIN(3, l));
                L[16*j + ii] = l;
            }
        }

        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                y[i].qs[j/4 + l] = L[j + l] | (L[j + l + 32] << 2) | (L[j + l + 64] << 4) | (L[j + l + 96] << 6);
            }
        }

        x += QK_K;
    }
}